

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O1

bool __thiscall SharedMemoryManager::AttachShMem(SharedMemoryManager *this)

{
  void *pvVar1;
  
  pvVar1 = shmat(this->sh_mem_id_,(void *)0x0,0);
  this->sh_mem_start_addr_ = pvVar1;
  if (pvVar1 != (void *)0xffffffffffffffff) {
    this->total_attached_ = this->total_attached_ + 1;
  }
  return pvVar1 != (void *)0xffffffffffffffff;
}

Assistant:

bool SharedMemoryManager::AttachShMem()
{            
	sh_mem_start_addr_ = shmat(sh_mem_id_ , NULL, 0);

	if (sh_mem_start_addr_ == (void *) -1) {
        DEBUG_ELOG("shmat error: "<< strerror(errno) <<",sh_mem_id_="<<sh_mem_id_);
		return false;
	}
    total_attached_ ++ ;
    return true;
}